

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GPUShader5PreciseQualifier::iterate(GPUShader5PreciseQualifier *this)

{
  GLfloat GVar1;
  bool bVar2;
  GLuint GVar3;
  GLuint component_nr_1;
  long lVar4;
  char *description;
  int iVar5;
  GLuint component_nr;
  long lVar6;
  GLfloat vertex_data_weights [4];
  GLfloat vertex_data_positions [4];
  WeightedSum weighted_sum_backward [4];
  WeightedSum weighted_sum_forward [4];
  float local_7c;
  GLfloat local_78 [3];
  float fStack_6c;
  GLfloat local_68 [4];
  WeightedSum local_58;
  uint local_54;
  uint local_50;
  WeightedSum local_48;
  uint local_44;
  uint local_40;
  
  initTest(this);
  TestCaseBase::randomSeed(&this->super_TestCaseBase,1);
  bVar2 = false;
  iVar5 = 0;
  do {
    lVar6 = 0;
    local_7c = 1.0;
    do {
      GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,2000);
      local_68[lVar6] = (float)(int)(GVar3 - 1000);
      if (lVar6 == 3) {
        fStack_6c = local_7c;
      }
      else {
        GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,1000);
        local_78[lVar6] = (float)GVar3 / 1000.0;
        local_7c = local_7c - (float)GVar3 / 1000.0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    drawAndGetFeedbackResult(this,local_68,local_78,&local_48);
    lVar6 = 0xc;
    lVar4 = 0;
    do {
      GVar1 = local_68[lVar4];
      local_68[lVar4] = *(GLfloat *)((long)local_68 + lVar6);
      *(GLfloat *)((long)local_68 + lVar6) = GVar1;
      GVar1 = local_78[lVar4];
      local_78[lVar4] = *(GLfloat *)((long)local_78 + lVar6);
      *(GLfloat *)((long)local_78 + lVar6) = GVar1;
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + -4;
    } while (lVar4 == 1);
    drawAndGetFeedbackResult(this,local_68,local_78,&local_58);
    if (local_58.intv != local_40 ||
        ((local_44 != local_58.intv || (local_48.intv != local_58.intv || local_50 != local_58.intv)
         ) || local_54 != local_58.intv)) {
      bVar2 = true;
    }
  } while ((local_58.intv == local_40 &&
            ((local_44 == local_58.intv &&
             (local_48.intv == local_58.intv && local_50 == local_58.intv)) &&
            local_54 == local_58.intv)) && (iVar5 = iVar5 + 1, iVar5 != 100));
  if (!bVar2) {
    description = "Pass";
  }
  else {
    description = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar2,
             description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5PreciseQualifier::iterate(void)
{
	initTest();

	/* Set the seed for the random generator */
	randomSeed(1);

	glw::GLboolean test_failed = false;

	for (glw::GLuint test_iter = 0; test_iter < m_n_iterations; ++test_iter)
	{
		/* Create the data for positions and weights attributes */
		glw::GLfloat vertex_data_positions[m_n_components];
		glw::GLfloat vertex_data_weights[m_n_components];
		glw::GLfloat weights_sum = 1.0f;

		for (glw::GLuint component_nr = 0; component_nr < m_n_components; ++component_nr)
		{
			vertex_data_positions[component_nr] = static_cast<glw::GLfloat>(
				static_cast<glw::GLint>(randomFormula(2 * m_position_range)) - m_position_range);

			if (component_nr != (m_n_components - 1))
			{
				glw::GLfloat random_value = static_cast<glw::GLfloat>(randomFormula(m_position_range)) /
											static_cast<glw::GLfloat>(m_position_range);

				vertex_data_weights[component_nr] = random_value;
				weights_sum -= random_value;
			}
			else
			{
				vertex_data_weights[component_nr] = weights_sum;
			}
		}

		/* Compute forward weighted sum */
		WeightedSum weighted_sum_forward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_forward);

		/* Reverse the data for positions and weights attributes */
		glw::GLfloat temp_value = 0.0f;

		for (glw::GLuint component_nr = 0; component_nr < (m_n_components / 2); ++component_nr)
		{
			temp_value = vertex_data_positions[component_nr];

			vertex_data_positions[component_nr] = vertex_data_positions[m_n_components - 1 - component_nr];
			vertex_data_positions[m_n_components - 1 - component_nr] = temp_value;

			temp_value = vertex_data_weights[component_nr];

			vertex_data_weights[component_nr] = vertex_data_weights[m_n_components - 1 - component_nr];
			vertex_data_weights[m_n_components - 1 - component_nr] = temp_value;
		}

		/* Compute backward weighted sum */
		WeightedSum weighted_sum_backward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_backward);

		/* Check if results are bitwise accurate */
		if (weighted_sum_backward[0].intv != weighted_sum_backward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_backward[2].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[0].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[2].intv)
		{
			test_failed = true;
			break;
		}
	}

	if (test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}